

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CompileLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  uint uVar1;
  sxu32 nKeyLen;
  SyToken *pValue;
  char *zLeft;
  void *pvVar2;
  sxi32 sVar3;
  uchar *zSrc;
  jx9_value *pjVar4;
  GenBlock *pGVar5;
  anon_union_8_3_18420de5_for_x aVar6;
  jx9_vm *pjVar7;
  sxu32 nIdx;
  uint local_1c;
  
  pValue = pGen->pIn;
  uVar1 = (pValue->sData).nByte;
  switch(uVar1) {
  case 4:
    zLeft = (pValue->sData).zString;
    sVar3 = SyStrnicmp(zLeft,"null",4);
    if (sVar3 == 0) {
      pjVar7 = pGen->pVm;
      sVar3 = 0;
      local_1c = 0;
      goto LAB_0012a077;
    }
    sVar3 = SyStrnicmp(zLeft,"true",4);
    if (sVar3 == 0) {
      pjVar7 = pGen->pVm;
      sVar3 = 0;
      local_1c = 1;
      goto LAB_0012a077;
    }
    break;
  case 5:
    sVar3 = SyStrnicmp((pValue->sData).zString,"false",5);
    if (sVar3 == 0) {
      pjVar7 = pGen->pVm;
      sVar3 = 0;
      local_1c = 2;
      goto LAB_0012a077;
    }
    if (uVar1 == 0xc) goto switchD_00129f39_caseD_c;
    if (uVar1 == 8) goto switchD_00129f39_caseD_8;
    break;
  case 8:
switchD_00129f39_caseD_8:
    sVar3 = SyMemcmp((pValue->sData).zString,"__LINE__",8);
    if (sVar3 == 0) {
      pjVar4 = jx9VmReserveConstObj(pGen->pVm,&local_1c);
      if (pjVar4 == (jx9_value *)0x0) {
        jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
        return -10;
      }
      pjVar7 = pGen->pVm;
      aVar6.iVal._4_4_ = 0;
      aVar6.iVal._0_4_ = pValue->nLine;
      pjVar4->pVm = (jx9_vm *)0x0;
      (pjVar4->sBlob).pAllocator = (SyMemBackend *)0x0;
      *(undefined8 *)&(pjVar4->sBlob).nFlags = 0;
      *(undefined8 *)&pjVar4->nIdx = 0;
      (pjVar4->x).rVal = 0.0;
      *(undefined8 *)&pjVar4->iFlags = 0;
      (pjVar4->sBlob).pBlob = (void *)0x0;
      (pjVar4->sBlob).nByte = 0;
      (pjVar4->sBlob).mByte = 0;
      pjVar4->pVm = pjVar7;
      (pjVar4->sBlob).pAllocator = &pjVar7->sAllocator;
      (pjVar4->sBlob).nFlags = 0;
      pjVar4->x = aVar6;
      pjVar4->iFlags = 2;
      pjVar7 = pGen->pVm;
      sVar3 = 0;
      goto LAB_0012a077;
    }
    if (uVar1 == 0xc) goto switchD_00129f39_caseD_c;
    break;
  case 0xc:
switchD_00129f39_caseD_c:
    sVar3 = SyMemcmp((pValue->sData).zString,"__FUNCTION__",0xc);
    if (sVar3 == 0) {
      pGVar5 = pGen->pCurrent;
      while( true ) {
        if (pGVar5 == (GenBlock *)0x0) {
          jx9VmEmitInstr(pGen->pVm,4,0,0,(void *)0x0,(sxu32 *)0x0);
          return 0;
        }
        if ((pGVar5->iFlags & 8) != 0) break;
        pGVar5 = pGVar5->pParent;
      }
      pvVar2 = pGVar5->pUserData;
      pjVar4 = jx9VmReserveConstObj(pGen->pVm,&local_1c);
      if (pjVar4 != (jx9_value *)0x0) {
        jx9MemObjInitFromString(pGen->pVm,pjVar4,(SyString *)((long)pvVar2 + 0x50));
        jx9VmEmitInstr(pGen->pVm,4,0,local_1c,(void *)0x0,(sxu32 *)0x0);
        return 0;
      }
      jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
      return -10;
    }
  }
  sVar3 = GenStateFindLiteral(pGen,&pValue->sData,&local_1c);
  if (sVar3 != 0) {
    pjVar4 = jx9VmReserveConstObj(pGen->pVm,&local_1c);
    if (pjVar4 == (jx9_value *)0x0) {
      jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
    }
    else {
      jx9MemObjInitFromString(pGen->pVm,pjVar4,&pValue->sData);
      nKeyLen = (pjVar4->sBlob).nByte;
      if (nKeyLen != 0) {
        SyHashInsert(&pGen->hLiteral,(pjVar4->sBlob).pBlob,nKeyLen,(void *)(ulong)local_1c);
      }
    }
    if (pjVar4 == (jx9_value *)0x0) {
      return -10;
    }
  }
  pjVar7 = pGen->pVm;
  sVar3 = 1;
LAB_0012a077:
  jx9VmEmitInstr(pjVar7,4,sVar3,local_1c,(void *)0x0,(sxu32 *)0x0);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	SyToken *pToken = pGen->pIn;
	jx9_value *pObj;
	SyString *pStr;	
	sxu32 nIdx;
	/* Extract token value */
	pStr = &pToken->sData;
	/* Deal with the reserved literals [i.e: null, false, true, ...] first */
	if( pStr->nByte == sizeof("NULL") - 1 ){
		if( SyStrnicmp(pStr->zString, "null", sizeof("NULL")-1) == 0 ){
			/* NULL constant are always indexed at 0 */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 0, 0, 0);
			return SXRET_OK;
		}else if( SyStrnicmp(pStr->zString, "true", sizeof("TRUE")-1) == 0 ){
			/* TRUE constant are always indexed at 1 */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 1, 0, 0);
			return SXRET_OK;
		}
	}else if (pStr->nByte == sizeof("FALSE") - 1 &&
		SyStrnicmp(pStr->zString, "false", sizeof("FALSE")-1) == 0 ){
			/* FALSE constant are always indexed at 2 */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 2, 0, 0);
			return SXRET_OK;
	}else if(pStr->nByte == sizeof("__LINE__") - 1 &&
		SyMemcmp(pStr->zString, "__LINE__", sizeof("__LINE__")-1) == 0 ){
			/* TICKET 1433-004: __LINE__ constant must be resolved at compile time, not run time */
			pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
			if( pObj == 0 ){
				SXUNUSED(iCompileFlag); /* cc warning */
				return GenStateOutOfMem(pGen);
			}
			jx9MemObjInitFromInt(pGen->pVm, pObj, pToken->nLine);
			/* Emit the load constant instruction */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
			return SXRET_OK;
	}else if( pStr->nByte == sizeof("__FUNCTION__") - 1 &&
		SyMemcmp(pStr->zString, "__FUNCTION__", sizeof("__FUNCTION__")-1) == 0 ){
			GenBlock *pBlock = pGen->pCurrent;
			/* TICKET 1433-004: __FUNCTION__/__METHOD__ constants must be resolved at compile time, not run time */
			while( pBlock && (pBlock->iFlags & GEN_BLOCK_FUNC) == 0 ){
				/* Point to the upper block */
				pBlock = pBlock->pParent;
			}
			if( pBlock == 0 ){
				/* Called in the global scope, load NULL */
				jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 0, 0, 0);
			}else{
				/* Extract the target function/method */
				jx9_vm_func *pFunc = (jx9_vm_func *)pBlock->pUserData;
				pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
				if( pObj == 0 ){
					return GenStateOutOfMem(pGen);
				}
				jx9MemObjInitFromString(pGen->pVm, pObj, &pFunc->sName);
				/* Emit the load constant instruction */
				jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
			}
			return SXRET_OK;
	}
	/* Query literal table */
	if( SXRET_OK != GenStateFindLiteral(&(*pGen), &pToken->sData, &nIdx) ){
		jx9_value *pObj;
		/* Unknown literal, install it in the literal table */
		pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
		if( pObj == 0 ){
			return GenStateOutOfMem(pGen);
		}
		jx9MemObjInitFromString(pGen->pVm, pObj, &pToken->sData);
		GenStateInstallLiteral(&(*pGen), pObj, nIdx);
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm,JX9_OP_LOADC,1,nIdx, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}